

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  
  pIVar1 = (ILogger *)operator_new(8);
  *(code **)pIVar1 = liblogger::LogAlert;
  liblogger::LogManager::Add(pIVar1);
  liblogger::LogManager::PrintAll();
  liblogger::LogDebug("Debug Logging #1");
  liblogger::LogDebug("Debug Logging #%d",2);
  liblogger::LogInfo("Info Logging #1");
  liblogger::LogInfo("Info Logging #%d",2);
  liblogger::LogNotice("Notice Logging #1");
  liblogger::LogNotice("%s Logging #2","Notice");
  liblogger::LogWarning("Warning!!!!!!");
  liblogger::LogWarning("Warning!!!!!! #%d",2);
  liblogger::LogError("This is an Error");
  liblogger::LogError("This is an Error %d",2);
  liblogger::LogError("Something Critical happened");
  liblogger::LogError("Something Critical happened %s","Really BAD!");
  liblogger::LogAlert("Alert Alert");
  liblogger::LogAlert("Alert Alert %s","Alert");
  liblogger::LogCritical("TestLog Critical!");
  liblogger::LogEmergency("TestLog Emergency!");
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

	examples();

	LogManager::RemoveAll();
	return 0;
}